

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall Clasp::ShortImplicationsGraph::ImplicationList::clear(ImplicationList *this,bool b)

{
  __pointer_type pBVar1;
  __pointer_type pBVar2;
  uint uVar3;
  undefined3 in_register_00000031;
  
  uVar3 = *(uint *)&(this->super_ImpListBase).super_type.
                    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                    .field_0x8;
  if (CONCAT31(in_register_00000031,b) == 0) {
    uVar3 = uVar3 & 0x7fffffff;
  }
  else {
    if ((int)uVar3 < 0) {
      operator_delete((this->super_ImpListBase).super_type.
                      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                      .buf_);
    }
    (this->super_ImpListBase).super_type.
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
         (buf_type *)0x0;
    *(undefined4 *)
     &(this->super_ImpListBase).super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x8 = 0
    ;
    uVar3 = 0;
  }
  (this->super_ImpListBase).super_type.
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
  (this->super_ImpListBase).super_type.
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = uVar3;
  pBVar2 = (this->learnt)._M_b._M_p;
  while (pBVar2 != (__pointer_type)0x0) {
    pBVar1 = (pBVar2->next)._M_b._M_p;
    operator_delete(pBVar2);
    pBVar2 = pBVar1;
  }
  LOCK();
  (this->learnt)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  return;
}

Assistant:

void ShortImplicationsGraph::ImplicationList::clear(bool b) {
	ImpListBase::clear(b);
	for (Block* x = learnt; x; ) {
		Block* t = x;
		x = x->next;
		delete t;
	}
	learnt = 0;
}